

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerResults::GenHeaderBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  byte bVar1;
  char *pcVar2;
  DevAddress devAddress;
  string srcName;
  string dstName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string dstStr;
  string srcStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = (byte)((*(ulong *)(frame + 0x10) & 0xffffffff) >> 4) & 0xf;
  devAddress = (DevAddress)*(ulong *)(frame + 0x10) & DevAddress_UnregBcast;
  GetNumberString_abi_cxx11_(&srcStr,this,(ulong)bVar1,4);
  GetNumberString_abi_cxx11_(&dstStr,this,(ulong)devAddress,4);
  if (this->mTabular == false) {
    std::__cxx11::string::string((string *)&srcName,"H",(allocator *)&dstName);
    AddResult(this,&srcName);
    std::__cxx11::string::~string((string *)&srcName);
    std::operator+(&local_160,"H ",&srcStr);
    std::operator+(&dstName,&local_160," to ");
    std::operator+(&srcName,&dstName,&dstStr);
    AddResult(this,&srcName);
    std::__cxx11::string::~string((string *)&srcName);
    std::__cxx11::string::~string((string *)&dstName);
    std::__cxx11::string::~string((string *)&local_160);
    std::operator+(&local_160,"Header SRC=",&srcStr);
    std::operator+(&dstName,&local_160,", DST=");
    std::operator+(&srcName,&dstName,&dstStr);
    AddResult(this,&srcName);
    std::__cxx11::string::~string((string *)&srcName);
    std::__cxx11::string::~string((string *)&dstName);
    std::__cxx11::string::~string((string *)&local_160);
  }
  pcVar2 = HdmiCec::GetDevAddressString((uint)bVar1);
  std::__cxx11::string::string((string *)&srcName,pcVar2,(allocator *)&dstName);
  pcVar2 = HdmiCec::GetDevAddressString(devAddress);
  std::__cxx11::string::string((string *)&dstName,pcVar2,(allocator *)&local_160);
  std::operator+(&local_100,"Header SRC=",&srcStr);
  std::operator+(&local_e0,&local_100," (");
  std::operator+(&local_c0,&local_e0,&srcName);
  std::operator+(&local_a0,&local_c0,"), DST=");
  std::operator+(&local_80,&local_a0,&dstStr);
  std::operator+(&local_60,&local_80," (");
  std::operator+(&local_40,&local_60,&dstName);
  std::operator+(&local_160,&local_40,")");
  AddResult(this,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&dstName);
  std::__cxx11::string::~string((string *)&srcName);
  std::__cxx11::string::~string((string *)&dstStr);
  std::__cxx11::string::~string((string *)&srcStr);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenHeaderBubble( const Frame& frame )
{
    const U8 src = ( frame.mData1 >> 4 ) & 0xF;
    const U8 dst = ( frame.mData1 >> 0 ) & 0xF;
    std::string srcStr = GetNumberString( src, 4 );
    std::string dstStr = GetNumberString( dst, 4 );

    if( !mTabular )
    {
        AddResult( "H" );
        AddResult( "H " + srcStr + " to " + dstStr );
        AddResult( "Header SRC=" + srcStr + ", DST=" + dstStr );
    }

    std::string srcName = HdmiCec::GetDevAddressString( static_cast<HdmiCec::DevAddress>( src ) );
    std::string dstName = HdmiCec::GetDevAddressString( static_cast<HdmiCec::DevAddress>( dst ) );

    AddResult( "Header SRC=" + srcStr + " (" + srcName + "), DST=" + dstStr + " (" + dstName + ")" );
}